

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSession::SendRTCPAPPPacket
          (RTPSession *this,uint8_t subtype,uint8_t *name,void *appdata,size_t appdatalen)

{
  uint8_t itemlength;
  int iVar1;
  uint8_t *itemdata;
  uint32_t senderssrc;
  RTCPCompoundPacketBuilder pb;
  
  if (this->created == true) {
    senderssrc = 0;
    if ((this->packetbuilder).init != false) {
      senderssrc = (this->packetbuilder).ssrc;
    }
    RTCPCompoundPacketBuilder::RTCPCompoundPacketBuilder(&pb,(this->super_RTPMemoryObject).mgr);
    iVar1 = RTCPCompoundPacketBuilder::InitBuild(&pb,this->maxpacksize);
    if (-1 < iVar1) {
      iVar1 = RTCPCompoundPacketBuilder::StartReceiverReport(&pb,senderssrc);
      if (-1 < iVar1) {
        iVar1 = RTCPCompoundPacketBuilder::AddSDESSource(&pb,senderssrc);
        if (-1 < iVar1) {
          if ((this->rtcpbuilder).init == false) {
            itemdata = (uint8_t *)0x0;
            itemlength = '\0';
          }
          else {
            itemdata = (this->rtcpbuilder).ownsdesinfo.super_RTCPSDESInfo.nonprivateitems[0].str;
            itemlength = (uint8_t)(int)(this->rtcpbuilder).ownsdesinfo.super_RTCPSDESInfo.
                                       nonprivateitems[0].length;
          }
          iVar1 = RTCPCompoundPacketBuilder::AddSDESNormalItem(&pb,CNAME,itemdata,itemlength);
          if (-1 < iVar1) {
            iVar1 = RTCPCompoundPacketBuilder::AddAPPPacket
                              (&pb,subtype,senderssrc,name,appdata,appdatalen);
            if (-1 < iVar1) {
              iVar1 = RTCPCompoundPacketBuilder::EndBuild(&pb);
              if (-1 < iVar1) {
                iVar1 = SendRTCPData(this,pb.super_RTCPCompoundPacket.compoundpacket,
                                     CONCAT44(pb.super_RTCPCompoundPacket.compoundpacketlength._4_4_
                                              ,(int)pb.super_RTCPCompoundPacket.compoundpacketlength
                                             ));
                if (-1 < iVar1) {
                  this->sentpackets = true;
                  iVar1 = (int)pb.super_RTCPCompoundPacket.compoundpacketlength;
                }
              }
            }
          }
        }
      }
    }
    RTCPCompoundPacketBuilder::~RTCPCompoundPacketBuilder(&pb);
  }
  else {
    iVar1 = -0x3e;
  }
  return iVar1;
}

Assistant:

int RTPSession::SendRTCPAPPPacket(uint8_t subtype, const uint8_t name[4], const void *appdata, size_t appdatalen)
{
	int status;

	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	BUILDER_LOCK
	uint32_t ssrc = packetbuilder.GetSSRC();
	BUILDER_UNLOCK
	
	RTCPCompoundPacketBuilder pb(GetMemoryManager());

	status = pb.InitBuild(maxpacksize);
	
	if(status < 0)
		return status;

	//first packet in an rtcp compound packet should always be SR or RR
	if((status = pb.StartReceiverReport(ssrc)) < 0)
		return status;

	//add SDES packet with CNAME item
	if ((status = pb.AddSDESSource(ssrc)) < 0)
		return status;
	
	BUILDER_LOCK
	size_t owncnamelen = 0;
	uint8_t *owncname = rtcpbuilder.GetLocalCNAME(&owncnamelen);

	if ((status = pb.AddSDESNormalItem(RTCPSDESPacket::CNAME,owncname,owncnamelen)) < 0)
	{
		BUILDER_UNLOCK
		return status;
	}
	BUILDER_UNLOCK
	
	//add our application specific packet
	if((status = pb.AddAPPPacket(subtype, ssrc, name, appdata, appdatalen)) < 0)
		return status;

	if((status = pb.EndBuild()) < 0)
		return status;

	//send packet
	status = SendRTCPData(pb.GetCompoundPacketData(),pb.GetCompoundPacketLength());
	if(status < 0)
		return status;

	PACKSENT_LOCK
	sentpackets = true;
	PACKSENT_UNLOCK

	return pb.GetCompoundPacketLength();
}